

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O0

void __thiscall sf::Texture::setSmooth(Texture *this,bool smooth)

{
  byte in_SIL;
  long in_RDI;
  TextureSaver save;
  TransientContextLock lock;
  TransientContextLock *in_stack_ffffffffffffffe0;
  undefined7 in_stack_fffffffffffffff0;
  
  if (((in_SIL & 1) != (*(byte *)(in_RDI + 0x14) & 1)) &&
     (*(byte *)(in_RDI + 0x14) = in_SIL & 1, *(int *)(in_RDI + 0x10) != 0)) {
    GlResource::TransientContextLock::TransientContextLock
              ((TransientContextLock *)
               (CONCAT17(in_SIL,in_stack_fffffffffffffff0) & 0x1ffffffffffffff));
    priv::TextureSaver::TextureSaver((TextureSaver *)0x219741);
    (*sf_glad_glBindTexture)(0xde1,*(GLuint *)(in_RDI + 0x10));
    (*sf_glad_glTexParameteri)(0xde1,0x2800,*(byte *)(in_RDI + 0x14) & 1 | 0x2600);
    if ((*(byte *)(in_RDI + 0x19) & 1) == 0) {
      (*sf_glad_glTexParameteri)(0xde1,0x2801,*(byte *)(in_RDI + 0x14) & 1 | 0x2600);
    }
    else {
      (*sf_glad_glTexParameteri)(0xde1,0x2801,*(byte *)(in_RDI + 0x14) & 1 | 0x2702);
    }
    priv::TextureSaver::~TextureSaver((TextureSaver *)0x21981a);
    GlResource::TransientContextLock::~TransientContextLock(in_stack_ffffffffffffffe0);
  }
  return;
}

Assistant:

void Texture::setSmooth(bool smooth)
{
    if (smooth != m_isSmooth)
    {
        m_isSmooth = smooth;

        if (m_texture)
        {
            TransientContextLock lock;

            // Make sure that the current texture binding will be preserved
            priv::TextureSaver save;

            glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
            glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));

            if (m_hasMipmap)
            {
                glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR_MIPMAP_LINEAR : GL_NEAREST_MIPMAP_LINEAR));
            }
            else
            {
                glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));
            }
        }
    }
}